

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O2

string * __thiscall FastPForLib::VByte::name_abi_cxx11_(string *__return_storage_ptr__,VByte *this)

{
  allocator local_9;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"VByte",&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return "VByte"; }